

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhombicToricLattice.cpp
# Opt level: O1

void __thiscall RhombicToricLattice::createVertexToEdges(RhombicToricLattice *this)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  iterator iVar4;
  long lVar5;
  pointer pvVar6;
  cartesian4 cVar7;
  int local_54;
  long *local_50 [2];
  long local_40 [2];
  
  iVar1 = (this->super_Lattice).l;
  if (0 < iVar1 * iVar1 * iVar1 * 2) {
    lVar5 = 0;
    uVar3 = 0;
    do {
      cVar7 = Lattice::indexToCoordinate(&this->super_Lattice,(int)uVar3);
      uVar2 = cVar7.z + cVar7.x + cVar7.y;
      if (cVar7._8_8_ >> 0x20 == 0) {
        if ((uVar2 & 1) == 0) {
          pvVar6 = (this->super_Lattice).vertexToEdges.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"xyz","");
          local_54 = (*(this->super_Lattice)._vptr_Lattice[2])
                               (this,uVar3 & 0xffffffff,(string *)local_50,1);
          iVar4._M_current =
               *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish + lVar5);
          if (iVar4._M_current ==
              *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_end_of_storage + lVar5)) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)
                       ((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar5),iVar4,&local_54);
          }
          else {
            *iVar4._M_current = local_54;
            *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish + lVar5) = iVar4._M_current + 1;
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          pvVar6 = (this->super_Lattice).vertexToEdges.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"xy","");
          local_54 = (*(this->super_Lattice)._vptr_Lattice[2])
                               (this,uVar3 & 0xffffffff,(string *)local_50,1);
          iVar4._M_current =
               *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish + lVar5);
          if (iVar4._M_current ==
              *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_end_of_storage + lVar5)) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)
                       ((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar5),iVar4,&local_54);
          }
          else {
            *iVar4._M_current = local_54;
            *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish + lVar5) = iVar4._M_current + 1;
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          pvVar6 = (this->super_Lattice).vertexToEdges.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"xz","");
          local_54 = (*(this->super_Lattice)._vptr_Lattice[2])
                               (this,uVar3 & 0xffffffff,(string *)local_50,1);
          iVar4._M_current =
               *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish + lVar5);
          if (iVar4._M_current ==
              *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_end_of_storage + lVar5)) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)
                       ((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar5),iVar4,&local_54);
          }
          else {
            *iVar4._M_current = local_54;
            *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish + lVar5) = iVar4._M_current + 1;
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          pvVar6 = (this->super_Lattice).vertexToEdges.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"yz","");
          local_54 = (*(this->super_Lattice)._vptr_Lattice[2])
                               (this,uVar3 & 0xffffffff,(string *)local_50,1);
          iVar4._M_current =
               *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish + lVar5);
          if (iVar4._M_current ==
              *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_end_of_storage + lVar5)) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)
                       ((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar5),iVar4,&local_54);
          }
          else {
            *iVar4._M_current = local_54;
            *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish + lVar5) = iVar4._M_current + 1;
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          pvVar6 = (this->super_Lattice).vertexToEdges.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"xyz","");
          local_54 = (*(this->super_Lattice)._vptr_Lattice[2])
                               (this,uVar3 & 0xffffffff,(string *)local_50,0xffffffff);
          iVar4._M_current =
               *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish + lVar5);
          if (iVar4._M_current ==
              *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_end_of_storage + lVar5)) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)
                       ((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar5),iVar4,&local_54);
          }
          else {
            *iVar4._M_current = local_54;
            *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish + lVar5) = iVar4._M_current + 1;
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          pvVar6 = (this->super_Lattice).vertexToEdges.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"xy","");
          local_54 = (*(this->super_Lattice)._vptr_Lattice[2])
                               (this,uVar3 & 0xffffffff,(string *)local_50,0xffffffff);
          iVar4._M_current =
               *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish + lVar5);
          if (iVar4._M_current ==
              *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_end_of_storage + lVar5)) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)
                       ((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar5),iVar4,&local_54);
          }
          else {
            *iVar4._M_current = local_54;
            *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish + lVar5) = iVar4._M_current + 1;
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          pvVar6 = (this->super_Lattice).vertexToEdges.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"xz","");
          local_54 = (*(this->super_Lattice)._vptr_Lattice[2])
                               (this,uVar3 & 0xffffffff,(string *)local_50,0xffffffff);
          iVar4._M_current =
               *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish + lVar5);
          if (iVar4._M_current ==
              *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_end_of_storage + lVar5)) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)
                       ((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar5),iVar4,&local_54);
          }
          else {
            *iVar4._M_current = local_54;
            *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish + lVar5) = iVar4._M_current + 1;
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          pvVar6 = (this->super_Lattice).vertexToEdges.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"yz","");
          local_54 = (*(this->super_Lattice)._vptr_Lattice[2])
                               (this,uVar3 & 0xffffffff,(string *)local_50,0xffffffff);
          iVar4._M_current =
               *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish + lVar5);
          if (iVar4._M_current !=
              *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_end_of_storage + lVar5))
          goto LAB_00124dc1;
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar5),iVar4,&local_54);
          goto LAB_00124dcc;
        }
      }
      else {
        if ((uVar2 & 1) == 0) {
          pvVar6 = (this->super_Lattice).vertexToEdges.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"xy","");
          local_54 = (*(this->super_Lattice)._vptr_Lattice[2])
                               (this,uVar3 & 0xffffffff,(string *)local_50,1);
          iVar4._M_current =
               *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish + lVar5);
          if (iVar4._M_current ==
              *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_end_of_storage + lVar5)) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)
                       ((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar5),iVar4,&local_54);
          }
          else {
            *iVar4._M_current = local_54;
            *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish + lVar5) = iVar4._M_current + 1;
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          pvVar6 = (this->super_Lattice).vertexToEdges.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"xz","");
          local_54 = (*(this->super_Lattice)._vptr_Lattice[2])
                               (this,uVar3 & 0xffffffff,(string *)local_50,1);
          iVar4._M_current =
               *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish + lVar5);
          if (iVar4._M_current ==
              *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_end_of_storage + lVar5)) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)
                       ((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar5),iVar4,&local_54);
          }
          else {
            *iVar4._M_current = local_54;
            *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish + lVar5) = iVar4._M_current + 1;
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          pvVar6 = (this->super_Lattice).vertexToEdges.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"yz","");
          local_54 = (*(this->super_Lattice)._vptr_Lattice[2])
                               (this,uVar3 & 0xffffffff,(string *)local_50,1);
          iVar4._M_current =
               *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish + lVar5);
          if (iVar4._M_current ==
              *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_end_of_storage + lVar5)) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)
                       ((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar5),iVar4,&local_54);
          }
          else {
            *iVar4._M_current = local_54;
            *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish + lVar5) = iVar4._M_current + 1;
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          pvVar6 = (this->super_Lattice).vertexToEdges.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"xyz","");
          local_54 = (*(this->super_Lattice)._vptr_Lattice[2])
                               (this,uVar3 & 0xffffffff,(string *)local_50,0xffffffff);
          iVar4._M_current =
               *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish + lVar5);
          if (iVar4._M_current ==
              *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_end_of_storage + lVar5)) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)
                       ((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar5),iVar4,&local_54);
          }
          else {
LAB_00124dc1:
            *iVar4._M_current = local_54;
            *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish + lVar5) = iVar4._M_current + 1;
          }
        }
        else {
          pvVar6 = (this->super_Lattice).vertexToEdges.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"xy","");
          local_54 = (*(this->super_Lattice)._vptr_Lattice[2])
                               (this,uVar3 & 0xffffffff,(string *)local_50,0xffffffff);
          iVar4._M_current =
               *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish + lVar5);
          if (iVar4._M_current ==
              *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_end_of_storage + lVar5)) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)
                       ((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar5),iVar4,&local_54);
          }
          else {
            *iVar4._M_current = local_54;
            *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish + lVar5) = iVar4._M_current + 1;
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          pvVar6 = (this->super_Lattice).vertexToEdges.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"xz","");
          local_54 = (*(this->super_Lattice)._vptr_Lattice[2])
                               (this,uVar3 & 0xffffffff,(string *)local_50,0xffffffff);
          iVar4._M_current =
               *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish + lVar5);
          if (iVar4._M_current ==
              *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_end_of_storage + lVar5)) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)
                       ((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar5),iVar4,&local_54);
          }
          else {
            *iVar4._M_current = local_54;
            *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish + lVar5) = iVar4._M_current + 1;
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          pvVar6 = (this->super_Lattice).vertexToEdges.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"yz","");
          local_54 = (*(this->super_Lattice)._vptr_Lattice[2])
                               (this,uVar3 & 0xffffffff,(string *)local_50,0xffffffff);
          iVar4._M_current =
               *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish + lVar5);
          if (iVar4._M_current ==
              *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_end_of_storage + lVar5)) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)
                       ((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar5),iVar4,&local_54);
          }
          else {
            *iVar4._M_current = local_54;
            *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish + lVar5) = iVar4._M_current + 1;
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          pvVar6 = (this->super_Lattice).vertexToEdges.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"xyz","");
          local_54 = (*(this->super_Lattice)._vptr_Lattice[2])
                               (this,uVar3 & 0xffffffff,(string *)local_50,1);
          iVar4._M_current =
               *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish + lVar5);
          if (iVar4._M_current !=
              *(int **)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_end_of_storage + lVar5))
          goto LAB_00124dc1;
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar5),iVar4,&local_54);
        }
LAB_00124dcc:
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
      uVar3 = uVar3 + 1;
      iVar1 = (this->super_Lattice).l;
      lVar5 = lVar5 + 0x18;
    } while ((long)uVar3 < (long)(iVar1 * iVar1 * iVar1 * 2));
  }
  return;
}

Assistant:

void RhombicToricLattice::createVertexToEdges()
{
    for (int vertexIndex = 0; vertexIndex < 2 * l * l * l; ++vertexIndex)
    {
        cartesian4 coordinate = indexToCoordinate(vertexIndex);
        if (coordinate.w == 0)
        {
            if ((coordinate.x + coordinate.y + coordinate.z) % 2 == 0)
            {
                int sign = 1;
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", sign));
                sign = -1;
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", sign));
            }
        }
        else
        {
            if ((coordinate.x + coordinate.y + coordinate.z) % 2 == 0)
            {
                int sign = 1;
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", sign));
                sign = -1;
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", sign));
            }
            else
            {
                int sign = -1;
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", sign));
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", sign));
                sign = 1;
                vertexToEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", sign));
            }
        }
    }
}